

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decide.cpp
# Opt level: O0

void get_CH(double *p1,int n,int *ch1)

{
  int iVar1;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  int i;
  double rd;
  double sum;
  int local_2c;
  double local_20;
  
  local_20 = 0.0;
  for (local_2c = 1; local_2c <= in_ESI; local_2c = local_2c + 1) {
    *(double *)(in_RDI + (long)local_2c * 8) =
         *(double *)(in_RDI + (long)local_2c * 8) * *(double *)(in_RDI + (long)local_2c * 8);
    local_20 = *(double *)(in_RDI + (long)local_2c * 8) + local_20;
  }
  for (local_2c = 1; local_2c <= in_ESI; local_2c = local_2c + 1) {
    *(double *)(in_RDI + (long)local_2c * 8) = *(double *)(in_RDI + (long)local_2c * 8) / local_20;
  }
  local_20 = 0.0;
  iVar1 = rand();
  local_2c = 1;
  while( true ) {
    if (in_ESI < local_2c) {
      return;
    }
    if ((double)(iVar1 % 10000) / 10000.0 < local_20 + *(double *)(in_RDI + (long)local_2c * 8))
    break;
    local_20 = *(double *)(in_RDI + (long)local_2c * 8) + local_20;
    local_2c = local_2c + 1;
  }
  *in_RDX = local_2c + -1;
  return;
}

Assistant:

void get_CH(double *p1, int n, int &ch1)
{
    double sum;
    double rd;
    int i;
    if(CHOOSE_TYPE==1)
    {
        sum = 0;
        rd = (double)(rand()%10000) / 10000.0;
        for (i = 1; i <= n; i++)
            if(sum + p1[i] > rd)
            {
                ch1 = i - 1;
                break;
            }
            else sum += p1[i];
    }
    else if(CHOOSE_TYPE==2||CHOOSE_TYPE==4)//把概率平方处理
    {
        //先平方，然后归一化一下
        sum = 0;
        for (i = 1; i <= n; i++)
        {
            if(CHOOSE_TYPE==2)
                p1[i]=p1[i]*p1[i];
            else p1[i]=pow(p1[i],1.5);
            sum+=p1[i];
        }
        for (i = 1; i <= n; i++)
            p1[i]=p1[i]/sum;
        sum=0;

        rd = (double)(rand()%10000) / 10000.0;
        for (i = 1; i <= n; i++)
            if(sum + p1[i] > rd)
            {
                ch1 = i - 1;
                break;
            }
            else sum += p1[i];
    }
    else if(CHOOSE_TYPE==3)//直接选个概率最大的。。。
    {
        double max_pro=0;
        for (i = 1; i <= n; i++)
            if(p1[i] > max_pro)
            {
                max_pro=p1[i];
                ch1=i-1;
            }
    }
}